

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall EventLoop::wakeup(EventLoop *this)

{
  ssize_t v;
  LogStream *pLVar1;
  Logger local_ff8;
  undefined8 local_20;
  uint64_t one;
  
  local_20 = 1;
  v = writen(this->wakeupFd_,&local_20,8);
  if (v != 8) {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/EventLoop.cpp"
                   ,0x3d);
    pLVar1 = LogStream::operator<<((LogStream *)&local_ff8,"EventLoop::wakeup() writes ");
    pLVar1 = LogStream::operator<<(pLVar1,v);
    LogStream::operator<<(pLVar1," bytes instead of 8");
    Logger::~Logger(&local_ff8);
  }
  return;
}

Assistant:

void EventLoop::wakeup() {
  uint64_t one = 1;
  ssize_t n = writen(wakeupFd_, (char*)(&one), sizeof one);
  if (n != sizeof one) {
    LOG << "EventLoop::wakeup() writes " << n << " bytes instead of 8";
  }
}